

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulativeCalendar.cpp
# Opt level: O0

void __thiscall
CumulativeCalProp::ttef_explanation_for_update_ub
          (CumulativeCalProp *this,int shift_in,int begin,int end,int task,int *bound,vec<Lit> *expl
          )

{
  long lVar1;
  int iVar2;
  int iVar3;
  Lit LVar4;
  int *piVar5;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  uint in_R8D;
  int *in_R9;
  list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> *in_stack_00000008;
  int en_lift;
  int expl_end;
  int expl_begin;
  int expl_ub;
  int expl_wdays_in;
  int new_lct;
  int min_wdays_in;
  int wdays_avail;
  int breaks;
  int en_avail;
  int wdays;
  int en_req;
  list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> tasks_cp;
  list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> tasks_tw;
  int *wPeriods;
  int *rPeriods;
  int maxLimit;
  IntVar *v;
  CumulativeCalProp *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  vec<Lit> *in_stack_fffffffffffffe70;
  IntVar *this_00;
  list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>
  *in_stack_fffffffffffffe80;
  list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>
  *in_stack_fffffffffffffe88;
  Lit in_stack_fffffffffffffe9c;
  CumulativeCalProp *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>
  *in_stack_fffffffffffffeb0;
  CumulativeCalProp *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  int *in_stack_fffffffffffffed0;
  list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>
  *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int local_104;
  list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>
  *in_stack_ffffffffffffff00;
  int local_dc;
  int local_9c;
  undefined1 local_98 [96];
  long local_38;
  long local_30;
  int local_24;
  int *local_20;
  uint local_18;
  int local_14;
  int local_10 [4];
  
  local_20 = in_R9;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10[0] = in_EDX;
  local_24 = max_limit((CumulativeCalProp *)0x1c8041);
  local_30 = *(long *)(*(long *)(in_RDI + 0xa0) + (long)(*(int *)(in_RDI + 0x94) + -1) * 8);
  lVar1 = *(long *)(in_RDI + 0xa0);
  piVar5 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x80),local_18);
  local_38 = *(long *)(lVar1 + (long)(*piVar5 + -1) * 8);
  std::__cxx11::list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>::list
            ((list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> *)
             0x1c80c0);
  v = (IntVar *)(local_98 + 0x30);
  std::__cxx11::list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>::list
            ((list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> *)
             0x1c80d5);
  local_98._44_4_ =
       ttef_retrieve_tasks((CumulativeCalProp *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                           in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                           in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,
                           in_stack_fffffffffffffed8,in_stack_ffffffffffffff00);
  if (*(int *)(in_RDI + 0x90) == 1) {
    local_dc = local_14 - local_10[0];
  }
  else {
    local_dc = *(int *)(local_30 + (long)local_10[0] * 4) - *(int *)(local_30 + (long)local_14 * 4);
  }
  local_98._24_4_ = local_dc;
  iVar2 = local_24 * local_dc - local_98._44_4_;
  local_98._16_4_ = (local_14 - local_10[0]) - local_dc;
  local_98._20_4_ = iVar2;
  local_98._12_4_ = min_usage(in_stack_fffffffffffffe60,(int)((ulong)v >> 0x20));
  local_98._12_4_ = iVar2 / (int)local_98._12_4_;
  local_98._8_4_ = local_98._12_4_ + 1;
  local_98._4_4_ =
       ttef_get_new_end_time
                 ((CumulativeCalProp *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                  ,in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,
                  (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8);
  if ((*(int *)(in_RDI + 0xc0) != 0) && (*(int *)(in_RDI + 0xc0) - 1U < 2)) {
    v = (IntVar *)local_98;
    ttef_analyse_tasks_right_shift
              (in_stack_fffffffffffffeb8,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
               (int)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,
               (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),in_stack_fffffffffffffed0);
  }
  local_9c = *(int *)(*(long *)(in_RDI + 0x170) + (long)(int)local_18 * 4);
  piVar5 = std::max<int>(local_10,&local_9c);
  local_104 = *piVar5;
  piVar5 = std::min<int>(&local_14,(int *)(*(long *)(in_RDI + 0x180) + (long)(int)local_18 * 4));
  if (*(int *)(in_RDI + 0x90) == 1) {
    local_104 = *piVar5 - local_104;
  }
  else {
    local_104 = *(int *)(local_38 + (long)local_104 * 4) - *(int *)(local_38 + (long)*piVar5 * 4);
  }
  local_98._0_4_ = local_104;
  min_usage(in_stack_fffffffffffffe60,(int)((ulong)v >> 0x20));
  min_usage(in_stack_fffffffffffffe60,(int)((ulong)v >> 0x20));
  iVar2 = local_9c;
  iVar3 = max_start0(in_stack_fffffffffffffe60,(int)((ulong)v >> 0x20));
  if (iVar2 < iVar3) {
    vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x38),local_18);
    getNegLeqLit(v,0);
    vec<Lit>::push(in_stack_fffffffffffffe70,
                   (Lit *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  }
  iVar2 = min_dur0(in_stack_fffffffffffffe60,(int)((ulong)v >> 0x20));
  iVar3 = min_dur(in_stack_fffffffffffffe60,(int)((ulong)v >> 0x20));
  if (iVar2 < iVar3) {
    in_stack_fffffffffffffeb0 = in_stack_00000008;
    in_stack_fffffffffffffeb8 =
         (CumulativeCalProp *)vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x48),local_18);
    in_stack_fffffffffffffea0 =
         (CumulativeCalProp *)(in_stack_fffffffffffffeb8->super_Propagator)._vptr_Propagator;
    min_dur(in_stack_fffffffffffffe60,(int)((ulong)v >> 0x20));
    in_stack_fffffffffffffe9c = getNegGeqLit(v,0);
    vec<Lit>::push(in_stack_fffffffffffffe70,
                   (Lit *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  }
  iVar2 = min_usage0(in_stack_fffffffffffffe60,(int)((ulong)v >> 0x20));
  iVar3 = min_usage(in_stack_fffffffffffffe60,(int)((ulong)v >> 0x20));
  if (iVar2 < iVar3) {
    in_stack_fffffffffffffe88 =
         (list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> *)
         vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x58),local_18);
    this_00 = (IntVar *)
              (in_stack_fffffffffffffe88->
              super__List_base<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    min_usage(in_stack_fffffffffffffe60,(int)((ulong)v >> 0x20));
    LVar4 = getNegGeqLit(v,0);
    vec<Lit>::push((vec<Lit> *)this_00,(Lit *)CONCAT44(LVar4.x,in_stack_fffffffffffffe68));
    in_stack_fffffffffffffe80 = in_stack_00000008;
  }
  ttef_analyse_limit_and_tasks
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c.x,iVar2,iVar3,
             in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,(int *)in_stack_fffffffffffffeb0,
             (vec<Lit> *)in_stack_fffffffffffffeb8);
  *local_20 = local_98._4_4_;
  std::__cxx11::list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>::~list
            ((list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> *)
             0x1c873b);
  std::__cxx11::list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>::~list
            ((list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> *)
             0x1c8748);
  return;
}

Assistant:

void CumulativeCalProp::ttef_explanation_for_update_ub(int shift_in, const int begin, const int end,
																											 const int task, int& bound, vec<Lit>& expl) {
	// Some constants
	const int maxLimit = max_limit();
	const int* rPeriods = workingPeriods[resCalendar - 1];
	const int* wPeriods = workingPeriods[taskCalendar[task] - 1];

	// Some variables
	std::list<TaskDur> tasks_tw;
	std::list<TaskDur> tasks_cp;

	// Retrieving tasks involved in the time interval [begin, end) excluding task 'task'
	const int en_req = ttef_retrieve_tasks(shift_in, begin, end, task, tasks_tw, tasks_cp);

	// Calculating the available energy in the time interval [begin, end)
	const int wdays = (rho == 1 ? end - begin : rPeriods[begin] - rPeriods[end]);
	const int en_avail = maxLimit * wdays - en_req;
	const int breaks = end - begin - wdays;

	// Calculating the working days available for the task 'task' in the considered time interval
	const int wdays_avail = en_avail / min_usage(task);
	const int min_wdays_in = wdays_avail + 1;

	// Determining the new upper bound on the latest completion time
	const int new_lct = ttef_get_new_end_time(begin, end, task, wdays_avail);

	// Some consistency checks
	assert(new_lct <= bound);
	assert(rho == 0 ||
				 en_avail < min_usage(task) * (std::min(end, lct_2[task]) - std::max(begin, lst_2[task])));
	assert(rho == 1 || en_avail < min_usage(task) * (wPeriods[std::max(begin, lst_2[task])] -
																									 wPeriods[std::min(end, lct_2[task])]));

	// Calculating the explanation lower bound on the start time
	int expl_wdays_in;
	int expl_ub;
	switch (ttef_expl_deg) {
		case ED_NORMAL:
		case ED_LIFT:
			expl_ub = ttef_analyse_tasks_right_shift(begin, end, min_wdays_in, task, 0, expl_wdays_in);
		case ED_NAIVE:
		default:
			expl_ub = lst_2[task];
			const int expl_begin = std::max(begin, expl_ub);
			const int expl_end = std::min(end, lct_2[task]);
			expl_wdays_in =
					(rho == 1 ? expl_end - expl_begin : wPeriods[expl_begin] - wPeriods[expl_end]);
	}

	// Calculating the lifting energy for the remainder
	int en_lift = min_usage(task) - 1 - (en_avail % min_usage(task));

	// More consistency checks
	assert(expl_ub >= lst_2[task]);
	assert(expl_wdays_in >= wdays_avail + 1);
	assert(en_lift >= 0);

	// Explaining the update for task 'task'
	if (expl_ub < max_start0(task)) {
		// start[task] <= expl_ub
		expl.push(getNegLeqLit(start[task], expl_ub));
	}
	// Get the negated literal for [[dur[task] >= min_dur(task)]]
	if (min_dur0(task) < min_dur(task)) {
		expl.push(getNegGeqLit(dur[task], min_dur(task)));
	}
	// Get the negated literal for [[usage[task] >= min_usage(task)]]
	if (min_usage0(task) < min_usage(task)) {
		expl.push(getNegGeqLit(usage[task], min_usage(task)));
	}

	// Retrieve explanation for the remaining tasks
	ttef_analyse_limit_and_tasks(begin, end, breaks, tasks_tw, tasks_cp, en_lift, expl);

	// Assigning new lower bound
	bound = new_lct;
}